

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O2

bool __thiscall
Assimp::Q3BSPFileImporter::importLightmap
          (Q3BSPFileImporter *this,Q3BSPModel *pModel,aiScene *pScene,aiMaterial *pMatHelper,
          int lightmapId)

{
  pointer ppsVar1;
  sQ3BSPLightmap *__src;
  bool bVar2;
  uint uVar3;
  aiTexture *paVar4;
  aiTexel *__dest;
  long lVar5;
  uchar *puVar6;
  aiTexture *pTexture;
  aiString local_424;
  
  if ((((lightmapId < 0 || pMatHelper == (aiMaterial *)0x0) ||
        (pScene == (aiScene *)0x0 || pModel == (Q3BSPModel *)0x0)) ||
      (ppsVar1 = (pModel->m_Lightmaps).
                 super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
      (int)((ulong)((long)(pModel->m_Lightmaps).
                          super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar1) >> 3) <=
      lightmapId)) || (__src = ppsVar1[(uint)lightmapId], __src == (sQ3BSPLightmap *)0x0)) {
    bVar2 = false;
  }
  else {
    paVar4 = (aiTexture *)operator_new(0x428);
    paVar4->pcData = (aiTexel *)0x0;
    (paVar4->mFilename).length = 0;
    (paVar4->mFilename).data[0] = '\0';
    memset((paVar4->mFilename).data + 1,0x1b,0x3ff);
    paVar4->achFormatHint[0] = '\0';
    paVar4->achFormatHint[1] = '\0';
    paVar4->achFormatHint[2] = '\0';
    paVar4->achFormatHint[3] = '\0';
    paVar4->mWidth = 0x80;
    paVar4->mHeight = 0x80;
    pTexture = paVar4;
    __dest = (aiTexel *)operator_new__(0x10000);
    paVar4->pcData = __dest;
    memcpy(__dest,__src,0x80);
    puVar6 = __src->bLMapData + 2;
    for (lVar5 = 0; lVar5 != 0x4000; lVar5 = lVar5 + 1) {
      paVar4->pcData[lVar5].r = ((sQ3BSPLightmap *)(puVar6 + -2))->bLMapData[0];
      paVar4->pcData[lVar5].g = puVar6[-1];
      paVar4->pcData[lVar5].b = *puVar6;
      paVar4->pcData[lVar5].a = 0xff;
      puVar6 = puVar6 + 3;
    }
    local_424.length = 0;
    memset(local_424.data + 1,0x1b,0x3ff);
    local_424.data[0] = '*';
    uVar3 = ASSIMP_itoa10(local_424.data + 1,0x3ff,
                          (int32_t)((ulong)((long)(this->mTextures).
                                                  super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this->mTextures).
                                                 super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 3));
    local_424.length = uVar3 + 1;
    aiMaterial::AddProperty(pMatHelper,&local_424,"$tex.file",10,1);
    std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::push_back(&this->mTextures,&pTexture);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Q3BSPFileImporter::importLightmap( const Q3BSP::Q3BSPModel *pModel, aiScene* pScene,
                                       aiMaterial *pMatHelper, int lightmapId )
{
    if (nullptr == pModel || nullptr == pScene || nullptr == pMatHelper ) {
        return false;
    }

    if ( lightmapId < 0 || lightmapId >= static_cast<int>( pModel->m_Lightmaps.size() ) ) {
        return false;
    }

    sQ3BSPLightmap *pLightMap = pModel->m_Lightmaps[ lightmapId ];
    if (nullptr == pLightMap ) {
        return false;
    }

    aiTexture *pTexture = new aiTexture;

    pTexture->mWidth = CE_BSP_LIGHTMAPWIDTH;
    pTexture->mHeight = CE_BSP_LIGHTMAPHEIGHT;
    pTexture->pcData = new aiTexel[CE_BSP_LIGHTMAPWIDTH * CE_BSP_LIGHTMAPHEIGHT];

    ::memcpy( pTexture->pcData, pLightMap->bLMapData, pTexture->mWidth );
    size_t p = 0;
    for ( size_t i = 0; i < CE_BSP_LIGHTMAPWIDTH * CE_BSP_LIGHTMAPHEIGHT; ++i ) {
        pTexture->pcData[ i ].r = pLightMap->bLMapData[ p++ ];
        pTexture->pcData[ i ].g = pLightMap->bLMapData[ p++ ];
        pTexture->pcData[ i ].b = pLightMap->bLMapData[ p++ ];
        pTexture->pcData[ i ].a = 0xFF;
    }

    aiString name;
    name.data[ 0 ] = '*';
    name.length = 1 + ASSIMP_itoa10( name.data + 1, static_cast<unsigned int>(MAXLEN-1), static_cast<int32_t>(mTextures.size()) );

    pMatHelper->AddProperty( &name,AI_MATKEY_TEXTURE_LIGHTMAP( 1 ) );
    mTextures.push_back( pTexture );

    return true;
}